

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void bitset_flip_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  ushort uVar1;
  uint16_t *end;
  uint64_t index;
  uint64_t pos;
  uint64_t newload;
  uint64_t load;
  uint64_t offset;
  uint64_t length_local;
  uint16_t *list_local;
  uint64_t *words_local;
  
  for (length_local = (uint64_t)list; (uint16_t *)length_local != list + length;
      length_local = length_local + 2) {
    uVar1 = *(ushort *)length_local >> 6;
    words[uVar1] = words[uVar1] ^ 1L << ((byte)*(ushort *)length_local & 0x3f);
  }
  return;
}

Assistant:

void bitset_flip_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    uint64_t offset, load, newload, pos, index;
    const uint16_t *end = list + length;
    while (list != end) {
        pos = *list;
        offset = pos >> 6;
        index = pos % 64;
        load = words[offset];
        newload = load ^ (UINT64_C(1) << index);
        words[offset] = newload;
        list++;
    }
}